

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Nf(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  Gia_Man_t *pNew;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  Jf_Par_t Pars;
  char Buffer [200];
  Jf_Par_t local_1f0;
  char local_f8 [200];
  
  Nf_ManSetDefaultPars(&local_1f0);
  Extra_UtilGetoptReset();
LAB_0022b1c1:
  while (iVar1 = Extra_UtilGetopt(argc,argv,"KCFARLEDQWakpqfvwh"), iVar6 = globalUtilOptind,
        0x65 < iVar1) {
    switch(iVar1) {
    case 0x70:
      local_1f0.fPinPerm = local_1f0.fPinPerm ^ 1;
      break;
    case 0x71:
      local_1f0.fPinQuick = local_1f0.fPinQuick ^ 1;
      break;
    case 0x72:
    case 0x73:
    case 0x74:
    case 0x75:
      goto switchD_0022b1e6_caseD_42;
    case 0x76:
      local_1f0.fVerbose = local_1f0.fVerbose ^ 1;
      break;
    case 0x77:
      local_1f0.fVeryVerbose = local_1f0.fVeryVerbose ^ 1;
      break;
    default:
      if (iVar1 == 0x66) {
        local_1f0.fPinFilter = local_1f0.fPinFilter ^ 1;
      }
      else {
        if (iVar1 != 0x6b) goto switchD_0022b1e6_caseD_42;
        local_1f0.fCoarsen = local_1f0.fCoarsen ^ 1;
      }
    }
  }
  switch(iVar1) {
  case 0x41:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-A\" should be followed by a positive integer.\n";
      goto LAB_0022b481;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_1f0.nRoundsEla = uVar2;
    break;
  case 0x42:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x53:
  case 0x54:
  case 0x55:
  case 0x56:
    goto switchD_0022b1e6_caseD_42;
  case 0x43:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-C\" should be followed by a positive integer.\n";
      goto LAB_0022b481;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar6 + 1;
    local_1f0.nCutNum = uVar2;
    if (((int)uVar2 < 1) || (local_1f0.nCutNumMax < (int)uVar2)) {
      pcVar5 = "This number of cuts (%d) is not supported.\n";
      goto LAB_0022b49f;
    }
    goto LAB_0022b1c1;
  case 0x44:
    if (argc <= globalUtilOptind) {
LAB_0022b3d0:
      pcVar5 = "Command line switch \"-D\" should be followed by an integer number.\n";
LAB_0022b481:
      Abc_Print(-1,pcVar5);
      goto switchD_0022b1e6_caseD_42;
    }
    local_1f0.DelayTarget = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar6 + 1;
    if (local_1f0.DelayTarget < 1) goto LAB_0022b4b1;
    goto LAB_0022b1c1;
  case 0x45:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-E\" should be followed by an integer number.\n";
      goto LAB_0022b443;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_1f0.nAreaTuner = uVar2;
    break;
  case 0x46:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-F\" should be followed by a positive integer.\n";
      goto LAB_0022b481;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_1f0.nRounds = uVar2;
    break;
  case 0x4b:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-K\" should be followed by a positive integer.\n";
      goto LAB_0022b481;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar6 + 1;
    local_1f0.nLutSize = uVar2;
    if (((int)uVar2 < 2) || (local_1f0.nLutSizeMax < (int)uVar2)) {
      pcVar5 = "LUT size %d is not supported.\n";
LAB_0022b49f:
      globalUtilOptind = iVar6 + 1;
      Abc_Print(-1,pcVar5,(ulong)uVar2);
switchD_0022b1e6_caseD_42:
LAB_0022b4b1:
      if (local_1f0.DelayTarget == 0xffffffff) {
        builtin_strncpy(local_f8 + 8,"sible",6);
        builtin_strncpy(local_f8,"best pos",8);
      }
      else {
        sprintf(local_f8,"%d",(ulong)(uint)local_1f0.DelayTarget);
      }
      Abc_Print(-2,"usage: &nf [-KCFARLEDQ num] [-akpqfvwh]\n");
      Abc_Print(-2,"\t           performs technology mapping of the network\n");
      Abc_Print(-2,"\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n",
                (ulong)(uint)local_1f0.nLutSizeMax,(ulong)(uint)local_1f0.nLutSize);
      Abc_Print(-2,"\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n",
                (ulong)(uint)local_1f0.nCutNumMax,(ulong)(uint)local_1f0.nCutNum);
      Abc_Print(-2,"\t-F num   : the number of area flow rounds [default = %d]\n",
                (ulong)(uint)local_1f0.nRounds);
      Abc_Print(-2,
                "\t-A num   : the number of exact area rounds (when \'-a\' is used) [default = %d]\n"
                ,(ulong)(uint)local_1f0.nRoundsEla);
      Abc_Print(-2,"\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n",
                (ulong)(uint)local_1f0.nRelaxRatio);
      Abc_Print(-2,
                "\t-L num   : the fanout limit for coarsening XOR/MUX (num >= 2) [default = %d]\n",
                (ulong)(uint)local_1f0.nCoarseLimit);
      Abc_Print(-2,
                "\t-E num   : the area/edge tradeoff parameter (0 <= num <= 100) [default = %d]\n",
                (ulong)(uint)local_1f0.nAreaTuner);
      Abc_Print(-2,"\t-D num   : sets the delay constraint for the mapping [default = %s]\n",
                local_f8);
      Abc_Print(-2,"\t-Q num   : internal parameter impacting area of the mapping [default = %d]\n",
                (ulong)(uint)local_1f0.nReqTimeFlex);
      pcVar4 = "yes";
      pcVar5 = "yes";
      if (local_1f0.fAreaOnly == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-a       : toggles area-oriented mapping [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_1f0.fCoarsen == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-k       : toggles coarsening the subject graph [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_1f0.fPinPerm == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,
                "\t-p       : toggles pin permutation (more matches - better quality) [default = %s]\n"
                ,pcVar5);
      pcVar5 = "yes";
      if (local_1f0.fPinQuick == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,
                "\t-q       : toggles quick mapping (fewer matches - worse quality) [default = %s]\n"
                ,pcVar5);
      pcVar5 = "yes";
      if (local_1f0.fPinFilter == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,
                "\t-f       : toggles filtering matches (useful with unit delay model) [default = %s]\n"
                ,pcVar5);
      pcVar5 = "yes";
      if (local_1f0.fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v       : toggles verbose output [default = %s]\n",pcVar5);
      if (local_1f0.fVeryVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-w       : toggles very verbose output [default = %s]\n",pcVar4);
      pcVar5 = "\t-h       : prints the command usage\n";
      iVar6 = -2;
LAB_0022b6f4:
      Abc_Print(iVar6,pcVar5);
      return 1;
    }
    goto LAB_0022b1c1;
  case 0x4c:
    if (argc <= globalUtilOptind) {
LAB_0022b3dc:
      pcVar5 = "Command line switch \"-R\" should be followed by an integer number.\n";
LAB_0022b443:
      Abc_Print(1,pcVar5);
      return 0;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_1f0.nCoarseLimit = uVar2;
    break;
  case 0x51:
    if (argc <= globalUtilOptind) goto LAB_0022b3d0;
    uVar2 = atoi(argv[globalUtilOptind]);
    local_1f0.nReqTimeFlex = uVar2;
    break;
  case 0x52:
    if (argc <= globalUtilOptind) goto LAB_0022b3dc;
    uVar2 = atoi(argv[globalUtilOptind]);
    local_1f0.nRelaxRatio = uVar2;
    break;
  case 0x57:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-W\" should be followed by a positive integer.\n";
      goto LAB_0022b481;
    }
    uVar2 = atoi(argv[globalUtilOptind]);
    local_1f0.nVerbLimit = uVar2;
    break;
  default:
    if (iVar1 != 0x61) {
      if (iVar1 != -1) goto switchD_0022b1e6_caseD_42;
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        pcVar5 = "Empty GIA network.\n";
      }
      else {
        pvVar3 = Abc_FrameReadLibGen();
        if (pvVar3 == (void *)0x0) {
          pcVar5 = "Current library is not available.\n";
        }
        else {
          pNew = Nf_ManPerformMapping(pAbc->pGia,&local_1f0);
          if (pNew != (Gia_Man_t *)0x0) {
            Abc_FrameUpdateGia(pAbc,pNew);
            return 0;
          }
          pcVar5 = "Abc_CommandAbc9Nf(): Mapping into LUTs has failed.\n";
        }
      }
      iVar6 = -1;
      goto LAB_0022b6f4;
    }
    local_1f0.fAreaOnly = local_1f0.fAreaOnly ^ 1;
    goto LAB_0022b1c1;
  }
  globalUtilOptind = iVar6 + 1;
  if ((int)uVar2 < 0) goto switchD_0022b1e6_caseD_42;
  goto LAB_0022b1c1;
}

Assistant:

int Abc_CommandAbc9Nf( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Nf_ManSetDefaultPars( Jf_Par_t * pPars );
    extern Gia_Man_t * Nf_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars );
    extern Gia_Man_t * Pf_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars );
    char Buffer[200];
    Jf_Par_t Pars, * pPars = &Pars;
    Gia_Man_t * pNew; int c;
    Nf_ManSetDefaultPars( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "KCFARLEDQWakpqfvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSize < 2 || pPars->nLutSize > pPars->nLutSizeMax )
            {
                Abc_Print( -1, "LUT size %d is not supported.\n", pPars->nLutSize );
                goto usage;
            }
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nCutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCutNum < 1 || pPars->nCutNum > pPars->nCutNumMax )
            {
                Abc_Print( -1, "This number of cuts (%d) is not supported.\n", pPars->nCutNum );
                goto usage;
            }
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nRounds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRounds < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nRoundsEla = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRoundsEla < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-R\" should be followed by an integer number.\n" );
                return 0;
            }
            pPars->nRelaxRatio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRelaxRatio < 0 ) 
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-R\" should be followed by an integer number.\n" );
                return 0;
            }
            pPars->nCoarseLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nCoarseLimit < 0 ) 
                goto usage;
            break;
        case 'E':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( 1, "Command line switch \"-E\" should be followed by an integer number.\n" );
                return 0;
            }
            pPars->nAreaTuner = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nAreaTuner < 0 ) 
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer number.\n" );
                goto usage;
            }
            pPars->DelayTarget = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->DelayTarget <= 0 )
                goto usage;
            break;
        case 'Q':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by an integer number.\n" );
                goto usage;
            }
            pPars->nReqTimeFlex = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nReqTimeFlex < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nVerbLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nVerbLimit < 0 )
                goto usage;
            break;
        case 'a':
            pPars->fAreaOnly ^= 1;
            break;
        case 'k':
            pPars->fCoarsen ^= 1;
            break;
        case 'p':
            pPars->fPinPerm ^= 1;
            break;
        case 'q':
            pPars->fPinQuick ^= 1;
            break;
        case 'f':
            pPars->fPinFilter ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Empty GIA network.\n" );
        return 1;
    }
    if ( Abc_FrameReadLibGen() == NULL )
    {
        Abc_Print( -1, "Current library is not available.\n" );
        return 1;
    }
//    if ( pPars->fAreaOnly )
//        pNew = Pf_ManPerformMapping( pAbc->pGia, pPars );
//    else
        pNew = Nf_ManPerformMapping( pAbc->pGia, pPars );
    if ( pNew == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Nf(): Mapping into LUTs has failed.\n" );
        return 1;
    }
    Abc_FrameUpdateGia( pAbc, pNew );
    return 0;

usage:
    if ( pPars->DelayTarget == -1 )
        sprintf(Buffer, "best possible" );
    else
        sprintf(Buffer, "%d", pPars->DelayTarget );
    Abc_Print( -2, "usage: &nf [-KCFARLEDQ num] [-akpqfvwh]\n" );
    Abc_Print( -2, "\t           performs technology mapping of the network\n" );
    Abc_Print( -2, "\t-K num   : LUT size for the mapping (2 <= K <= %d) [default = %d]\n",                  pPars->nLutSizeMax, pPars->nLutSize );
    Abc_Print( -2, "\t-C num   : the max number of priority cuts (1 <= C <= %d) [default = %d]\n",           pPars->nCutNumMax, pPars->nCutNum );
    Abc_Print( -2, "\t-F num   : the number of area flow rounds [default = %d]\n",                           pPars->nRounds );
    Abc_Print( -2, "\t-A num   : the number of exact area rounds (when \'-a\' is used) [default = %d]\n",    pPars->nRoundsEla );
    Abc_Print( -2, "\t-R num   : the delay relaxation ratio (num >= 0) [default = %d]\n",                    pPars->nRelaxRatio );
    Abc_Print( -2, "\t-L num   : the fanout limit for coarsening XOR/MUX (num >= 2) [default = %d]\n",       pPars->nCoarseLimit );
    Abc_Print( -2, "\t-E num   : the area/edge tradeoff parameter (0 <= num <= 100) [default = %d]\n",       pPars->nAreaTuner );
    Abc_Print( -2, "\t-D num   : sets the delay constraint for the mapping [default = %s]\n",                Buffer );
    Abc_Print( -2, "\t-Q num   : internal parameter impacting area of the mapping [default = %d]\n",         pPars->nReqTimeFlex );
    Abc_Print( -2, "\t-a       : toggles area-oriented mapping [default = %s]\n",                            pPars->fAreaOnly? "yes": "no" );
    Abc_Print( -2, "\t-k       : toggles coarsening the subject graph [default = %s]\n",                     pPars->fCoarsen? "yes": "no" );
    Abc_Print( -2, "\t-p       : toggles pin permutation (more matches - better quality) [default = %s]\n",  pPars->fPinPerm? "yes": "no" );
    Abc_Print( -2, "\t-q       : toggles quick mapping (fewer matches - worse quality) [default = %s]\n",    pPars->fPinQuick? "yes": "no" );
    Abc_Print( -2, "\t-f       : toggles filtering matches (useful with unit delay model) [default = %s]\n", pPars->fPinFilter? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggles verbose output [default = %s]\n",                                   pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w       : toggles very verbose output [default = %s]\n",                              pPars->fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : prints the command usage\n");
    return 1;
}